

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

bool __thiscall sf::Image::loadFromFile(Image *this,string *filename)

{
  bool bVar1;
  ImageLoader *this_00;
  
  this_00 = priv::ImageLoader::getInstance();
  bVar1 = priv::ImageLoader::loadImageFromFile(this_00,filename,&this->m_pixels,&this->m_size);
  return bVar1;
}

Assistant:

bool Image::loadFromFile(const std::string& filename)
{
    #ifndef SFML_SYSTEM_ANDROID

        return priv::ImageLoader::getInstance().loadImageFromFile(filename, m_pixels, m_size);

    #else

        priv::ResourceStream stream(filename);
        return loadFromStream(stream);

    #endif
}